

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O0

bool __thiscall GraphNode::isLeaf(GraphNode *this)

{
  bool bVar1;
  __weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  const_iterator local_30;
  weak_ptr<GraphNode> *local_28;
  __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
  local_20;
  __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
  local_18;
  iterator iter;
  GraphNode *this_local;
  
  iter._M_current = (weak_ptr<GraphNode> *)this;
  local_18._M_current =
       (weak_ptr<GraphNode> *)
       std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::begin
                 (&this->m_pointers);
  while( true ) {
    local_20._M_current =
         (weak_ptr<GraphNode> *)
         std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::end
                   (&this->m_pointers);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
               ::operator->(&local_18)->super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>;
    bVar1 = std::__weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>::expired(this_00);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<GraphNode>const*,std::vector<std::weak_ptr<GraphNode>,std::allocator<std::weak_ptr<GraphNode>>>>
      ::__normal_iterator<std::weak_ptr<GraphNode>*>
                ((__normal_iterator<std::weak_ptr<GraphNode>const*,std::vector<std::weak_ptr<GraphNode>,std::allocator<std::weak_ptr<GraphNode>>>>
                  *)&local_30,&local_18);
      local_28 = (weak_ptr<GraphNode> *)
                 std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
                 erase(&this->m_pointers,local_30);
      local_18._M_current = local_28;
      __gnu_cxx::
      __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
      ::operator--(&local_18,0);
    }
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<GraphNode>_*,_std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>_>
    ::operator++(&local_18,0);
  }
  bVar1 = std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::empty
                    (&this->m_pointers);
  return bVar1;
}

Assistant:

bool GraphNode::isLeaf() {

    // Remove inactive pointers
    for (auto iter = m_pointers.begin(); iter != m_pointers.end(); iter++)
        if (iter->expired()) {
            iter = m_pointers.erase(iter);
            iter--;
            //std::cout << "deleted a node" << std::endl;
        }

    //std::cout << "ok" << std::endl;
    return m_pointers.empty();
}